

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

Gla_Man_t * Gla_ManStart(Gia_Man_t *pGia0,Abs_Par_t *pPars)

{
  Gia_Obj_t *pGVar1;
  byte *pbVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  ulong uVar8;
  Abs_Par_t *pAVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Gla_Man_t *pGVar13;
  Vec_Int_t *pVVar14;
  int *piVar15;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar16;
  Gia_Man_t *p;
  int *__s;
  Gla_Obj_t *pGVar17;
  uint *puVar18;
  sat_solver2 *psVar19;
  Vec_Set_t *pVVar20;
  word **ppwVar21;
  word *pwVar22;
  Rnm_Man_t *pRVar23;
  uint uVar24;
  uint uVar25;
  Gla_Obj_t *pGVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  size_t sVar35;
  uint uVar36;
  long lVar37;
  Vec_Int_t **local_68;
  
  pGVar13 = (Gla_Man_t *)calloc(1,0xd0);
  pGVar13->pGia0 = pGia0;
  pGVar13->pPars = pPars;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = 100;
  pVVar14->nSize = 0;
  piVar15 = (int *)malloc(400);
  pVVar14->pArray = piVar15;
  pGVar13->vAbs = pVVar14;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = 100;
  pVVar14->nSize = 0;
  piVar15 = (int *)malloc(400);
  pVVar14->pArray = piVar15;
  pGVar13->vTemp = pVVar14;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = 100;
  pVVar14->nSize = 0;
  piVar15 = (int *)malloc(400);
  pVVar14->pArray = piVar15;
  pGVar13->vAddedNew = pVVar14;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = 100;
  pVVar14->nSize = 0;
  piVar15 = (int *)malloc(400);
  pVVar14->pArray = piVar15;
  pGVar13->vObjCounts = pVVar14;
  pAig = Gia_ManToAigSimple(pGia0);
  pCVar16 = Cnf_DeriveOther(pAig,1);
  pGVar13->pCnf = pCVar16;
  Aig_ManStop(pAig);
  p = Gia_ManDupMapped(pGia0,pCVar16->vMapping);
  pGVar13->pGia = p;
  if (pPars->fPropFanout != 0) {
    Gia_ManStaticFanoutStart(p);
  }
  if (pGia0->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("pGia0->vGateClasses != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x355,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  iVar10 = p->nObjs;
  lVar29 = (long)iVar10;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  iVar28 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar28 = iVar10;
  }
  pVVar14->nCap = iVar28;
  if (iVar28 == 0) {
    pVVar14->pArray = (int *)0x0;
    pVVar14->nSize = iVar10;
    p->vGateClasses = pVVar14;
    pVVar14 = (Vec_Int_t *)malloc(0x10);
    pVVar14->nCap = 0;
    pVVar14->pArray = (int *)0x0;
    pVVar14->nSize = iVar10;
  }
  else {
    sVar35 = (long)iVar28 * 4;
    piVar15 = (int *)malloc(sVar35);
    pVVar14->pArray = piVar15;
    pVVar14->nSize = iVar10;
    if (piVar15 != (int *)0x0) {
      memset(piVar15,0,lVar29 * 4);
    }
    p->vGateClasses = pVVar14;
    pVVar14 = (Vec_Int_t *)malloc(0x10);
    pVVar14->nCap = iVar28;
    piVar15 = (int *)malloc(sVar35);
    pVVar14->pArray = piVar15;
    pVVar14->nSize = iVar10;
    if (piVar15 != (int *)0x0) {
      memset(piVar15,0,lVar29 * 4);
    }
  }
  local_68 = &p->vGateClasses;
  pGVar13->vCoreCounts = pVVar14;
  pVVar14 = (Vec_Int_t *)calloc(1,0x10);
  pGVar13->vProofIds = pVVar14;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = iVar28;
  if (iVar28 == 0) {
    pVVar14->pArray = (int *)0x0;
    pVVar14->nSize = iVar10;
  }
  else {
    piVar15 = (int *)malloc((long)iVar28 << 2);
    pVVar14->pArray = piVar15;
    pVVar14->nSize = iVar10;
    if (piVar15 != (int *)0x0) {
      memset(piVar15,0,lVar29 * 4);
    }
  }
  sVar35 = lVar29 << 2;
  piVar15 = (int *)malloc(sVar35);
  memset(piVar15,0xff,sVar35);
  __s = (int *)malloc(sVar35);
  memset(__s,0xff,sVar35);
  iVar10 = pGia0->nObjs;
  if (0 < iVar10) {
    lVar29 = 0;
    do {
      pGVar5 = pGia0->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar24 = pGVar5[lVar29].Value;
      if (uVar24 != 0xffffffff) {
        if ((int)uVar24 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar24 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x364,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
        }
        puVar18 = &pGVar5[lVar29].Value;
        uVar24 = uVar24 >> 1;
        *puVar18 = uVar24;
        if (p->nObjs <= (int)uVar24) {
          __assert_fail("(int)pObj->Value < Gia_ManObjNum(p->pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x366,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
        }
        piVar15[uVar24] = pCVar16->pObj2Count[lVar29];
        __s[*puVar18] = pCVar16->pObj2Clause[lVar29];
        if (pGia0->vGateClasses->nSize <= lVar29) goto LAB_0060ac5a;
        if (pGia0->vGateClasses->pArray[lVar29] != 0) {
          uVar24 = *puVar18;
          if (((long)(int)uVar24 < 0) || ((*local_68)->nSize <= (int)uVar24)) goto LAB_0060acb7;
          (*local_68)->pArray[(int)uVar24] = 1;
        }
        pVVar6 = pCVar16->vMapping;
        if (pVVar6->nSize <= lVar29) goto LAB_0060ac5a;
        uVar24 = *puVar18;
        if (((long)(int)uVar24 < 0) || (pVVar14->nSize <= (int)uVar24)) {
LAB_0060acb7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar7 = pVVar6->pArray;
        uVar36 = piVar7[lVar29];
        pVVar14->pArray[(int)uVar24] = pVVar14->nSize;
        if (((int)uVar36 < 0) || (pVVar6->nSize <= (int)uVar36)) goto LAB_0060acd6;
        piVar7 = piVar7 + uVar36;
        Vec_IntPush(pVVar14,*piVar7);
        lVar37 = 0;
        do {
          uVar24 = piVar7[lVar37 + 1];
          if ((ulong)uVar24 == 0xffffffff) {
            uVar24 = 0xffffffff;
          }
          else {
            if (((int)uVar24 < 0) || (pGia0->nObjs <= (int)uVar24)) goto LAB_0060ac1c;
            uVar24 = pGia0->pObjs[uVar24].Value;
            if (uVar24 == 0xffffffff) {
              __assert_fail("~Gia_ManObj(pGia0, pMapping[k])->Value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                            ,0x377,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
            }
          }
          Vec_IntPush(pVVar14,uVar24);
          lVar37 = lVar37 + 1;
        } while (lVar37 != 4);
        iVar10 = pGia0->nObjs;
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < iVar10);
  }
  pVVar6 = pCVar16->vMapping;
  piVar7 = pVVar6->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar6);
  pCVar16->vMapping = pVVar14;
  if (pCVar16->pObj2Count != (int *)0x0) {
    free(pCVar16->pObj2Count);
  }
  pCVar16->pObj2Count = piVar15;
  if (pCVar16->pObj2Clause != (int *)0x0) {
    free(pCVar16->pObj2Clause);
  }
  pCVar16->pObj2Clause = __s;
  pGVar13->nObjs = 1;
  uVar24 = p->nObjs;
  uVar36 = 1;
  if ((0 < (int)uVar24) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    piVar15 = pCVar16->pObj2Count;
    puVar18 = &p->pObjs->Value;
    uVar27 = 0;
    uVar30 = 1;
    do {
      if (piVar15[uVar27] < 0) {
        uVar25 = 0xffffffff;
        uVar36 = uVar30;
      }
      else {
        pGVar13->nObjs = uVar30 + 1;
        uVar36 = uVar30 + 1;
        uVar25 = uVar30;
      }
      *puVar18 = uVar25;
      uVar27 = uVar27 + 1;
      puVar18 = puVar18 + 3;
      uVar30 = uVar36;
    } while (uVar24 != uVar27);
  }
  if (0 < pCVar16->nLiterals) {
    piVar15 = *pCVar16->pClauses;
    lVar29 = 0;
    do {
      uVar24 = piVar15[lVar29];
      uVar30 = (int)uVar24 >> 1;
      if (((int)uVar30 < 0) || (pGia0->nObjs <= (int)uVar30)) goto LAB_0060ac1c;
      uVar30 = pGia0->pObjs[uVar30].Value;
      if ((ulong)uVar30 == 0xffffffff) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x390,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      if (((int)uVar30 < 0) || (p->nObjs <= (int)uVar30)) goto LAB_0060ac1c;
      uVar30 = p->pObjs[uVar30].Value;
      if (uVar30 == 0xffffffff) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x393,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      piVar15[lVar29] = (uVar24 & 1) + uVar30 * 2;
      lVar29 = lVar29 + 1;
    } while (lVar29 < pCVar16->nLiterals);
    uVar24 = p->nObjs;
  }
  pGVar17 = (Gla_Obj_t *)calloc((long)(int)uVar36,0x28);
  pGVar13->pObjs = pGVar17;
  sVar35 = (long)(int)uVar24 * 4;
  puVar18 = (uint *)malloc(sVar35);
  memset(puVar18,0xff,sVar35);
  pGVar13->pObj2Obj = puVar18;
  if (0 < (int)uVar24) {
    pGVar5 = p->pObjs;
    lVar29 = 0;
    do {
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar5 + lVar29;
      uVar30 = pGVar1->Value;
      uVar27 = (ulong)uVar30;
      puVar18[lVar29] = uVar30;
      if (uVar27 != 0xffffffff) {
        if (((int)uVar30 < 0) || ((int)uVar36 <= (int)uVar30)) goto LAB_0060ad14;
        pGVar17[uVar27].iGiaObj = (int)lVar29;
        uVar30 = *(uint *)&pGVar17[uVar27].field_0x4;
        uVar25 = *(uint *)pGVar1 >> 0x1c & 2;
        *(uint *)&pGVar17[uVar27].field_0x4 = uVar30 & 0xfffffffd | uVar25;
        uVar33 = (uVar30 & 0xfffffff9 | uVar25) +
                 (uint)((~*(ulong *)pGVar1 & 0x1fffffff1fffffff) == 0) * 4;
        *(uint *)&pGVar17[uVar27].field_0x4 = uVar33;
        uVar25 = 0;
        uVar30 = 0;
        if (((uint)*(ulong *)pGVar1 & 0x9fffffff) == 0x9fffffff) {
          uVar30 = (uint)((int)((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff) <
                         p->vCis->nSize - p->nRegs) << 3;
        }
        *(uint *)&pGVar17[uVar27].field_0x4 = uVar33 & 0xfffffff7 | uVar30;
        uVar11 = (uint)*(ulong *)pGVar1;
        if ((~uVar11 & 0x1fffffff) != 0 && (int)uVar11 < 0) {
          uVar25 = (uint)((int)((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff) <
                         p->vCos->nSize - p->nRegs) << 4;
        }
        *(uint *)&pGVar17[uVar27].field_0x4 = uVar33 & 0xffffffe7 | uVar30 | uVar25;
        uVar34 = (uint)*(ulong *)pGVar1;
        uVar11 = 0;
        uVar32 = 0;
        if ((~uVar34 & 0x1fffffff) != 0 && (int)uVar34 < 0) {
          uVar32 = (uint)(p->vCos->nSize - p->nRegs <=
                         (int)((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff)) << 6;
        }
        *(uint *)&pGVar17[uVar27].field_0x4 = uVar33 & 0xffffffa7 | uVar30 | uVar25 | uVar32;
        if (((uint)*(ulong *)pGVar1 & 0x9fffffff) == 0x9fffffff) {
          uVar11 = (uint)(p->vCis->nSize - p->nRegs <=
                         (int)((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff)) << 5;
        }
        *(uint *)&pGVar17[uVar27].field_0x4 =
             uVar33 & 0xffffff87 | uVar30 | uVar25 | uVar32 | uVar11;
        uVar34 = (uint)((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) << 7;
        *(uint *)&pGVar17[uVar27].field_0x4 =
             uVar33 & 0xffffff07 | uVar30 | uVar25 | uVar32 | uVar11 | uVar34;
        uVar8 = *(ulong *)pGVar1;
        if ((~uVar8 & 0x1fffffff1fffffff) != 0) {
          uVar12 = (uint)uVar8;
          uVar31 = (uint)(uVar8 >> 0x20);
          if (((uVar12 & 0x9fffffff) != 0x9fffffff) ||
             (p->vCis->nSize - p->nRegs <= (int)(uVar31 & 0x1fffffff))) {
            if ((uVar8 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar12) {
              if ((int)uVar12 < 0 || (int)(uVar8 & 0x1fffffff) == 0x1fffffff) {
                if ((uVar12 & 0x9fffffff) != 0x9fffffff) {
LAB_0060adaf:
                  __assert_fail("Gia_ObjIsRo(p->pGia, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                                ,0x3bf,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
                }
                iVar10 = p->nRegs;
                pVVar14 = p->vCis;
                if ((int)(uVar31 & 0x1fffffff) < pVVar14->nSize - iVar10) goto LAB_0060adaf;
                *(uint *)&pGVar17[uVar27].field_0x4 =
                     uVar33 & 0x107 | uVar30 | uVar25 | uVar32 | uVar11 | uVar34 | 0x200;
                if (((uint)*(ulong *)pGVar1 & 0x9fffffff) != 0x9fffffff) {
LAB_0060ad90:
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar12 = (uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff;
                if ((int)uVar12 < pVVar14->nSize - iVar10) goto LAB_0060ad90;
                pVVar6 = p->vCos;
                uVar12 = (pVVar6->nSize - pVVar14->nSize) + uVar12;
                if (((int)uVar12 < 0) || (pVVar6->nSize <= (int)uVar12)) goto LAB_0060ac5a;
                piVar15 = pVVar6->pArray;
                uVar12 = piVar15[uVar12];
                if (uVar24 <= uVar12) goto LAB_0060ac1c;
                pGVar17[uVar27].Fanins[0] =
                     (pGVar5 + uVar12)
                     [-(ulong)((uint)*(undefined8 *)(pGVar5 + uVar12) & 0x1fffffff)].Value;
                if (((uint)*(ulong *)pGVar1 & 0x9fffffff) != 0x9fffffff) goto LAB_0060ad90;
                uVar12 = (uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff;
                if ((int)uVar12 < pVVar14->nSize - iVar10) goto LAB_0060ad90;
                uVar12 = (pVVar6->nSize - pVVar14->nSize) + uVar12;
                if (((int)uVar12 < 0) || (pVVar6->nSize <= (int)uVar12)) goto LAB_0060ac5a;
                uVar12 = piVar15[uVar12];
                if (((long)(int)uVar12 < 0) || (uVar24 <= uVar12)) goto LAB_0060ac1c;
                *(uint *)&pGVar17[uVar27].field_0x4 =
                     uVar33 & 0x105 | uVar30 | uVar25 | uVar32 | uVar11 | uVar34 | 0x200 |
                     *(uint *)(pGVar5 + (int)uVar12) >> 0x1c & 2;
              }
              else {
                uVar12 = pCVar16->vMapping->nSize;
                if ((int)uVar12 <= lVar29) goto LAB_0060ac5a;
                piVar15 = pCVar16->vMapping->pArray;
                uVar31 = piVar15[lVar29];
                if (((long)(int)uVar31 < 0) || (uVar12 <= uVar31)) {
LAB_0060acd6:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                }
                uVar34 = uVar33 & 0x107 | uVar30 | uVar25 | uVar32 | uVar11 | uVar34;
                *(uint *)&pGVar17[uVar27].field_0x4 = uVar34;
                lVar37 = 0;
                do {
                  uVar30 = piVar15[(long)(int)uVar31 + lVar37 + 1];
                  if ((ulong)uVar30 != 0xffffffff) {
                    if (uVar24 <= uVar30) goto LAB_0060ac1c;
                    uVar30 = pGVar5[uVar30].Value;
                    *(uint *)&pGVar17[uVar27].field_0x4 = uVar34 + 0x200;
                    pGVar17[uVar27].Fanins[uVar34 >> 9] = uVar30;
                    uVar34 = uVar34 + 0x200;
                  }
                  lVar37 = lVar37 + 1;
                } while (lVar37 != 4);
              }
            }
            else {
              *(uint *)&pGVar17[uVar27].field_0x4 =
                   uVar33 & 0x107 | uVar30 | uVar25 | uVar32 | uVar11 | uVar34 | 0x200;
              pGVar17[uVar27].Fanins[0] =
                   pGVar1[-(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff)].Value;
            }
          }
        }
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < (int)uVar24);
  }
  iVar10 = p->vCos->nSize;
  if (iVar10 <= p->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar10 < 1) {
LAB_0060ac5a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar10 = *p->vCos->pArray;
  if (((long)iVar10 < 0) || ((int)uVar24 <= iVar10)) {
LAB_0060ac1c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar24 = p->pObjs[iVar10].Value;
  if (((long)(int)uVar24 < 0) || ((int)uVar36 <= (int)uVar24)) {
LAB_0060ad14:
    __assert_fail("i >= 0 && i < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
  }
  pGVar26 = (Gla_Obj_t *)0x0;
  if (uVar24 != 0) {
    pGVar26 = pGVar17 + (int)uVar24;
  }
  pGVar13->pObjRoot = pGVar26;
  if (*local_68 == (Vec_Int_t *)0x0) {
    __assert_fail("p->pGia->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x3c6,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  if (1 < (int)uVar36) {
    uVar27 = 0x28;
    do {
      iVar10 = *(int *)((long)pGVar17->Fanins + (uVar27 - 8));
      if (((long)iVar10 < 0) || ((*local_68)->nSize <= iVar10)) goto LAB_0060ac5a;
      if ((*local_68)->pArray[iVar10] != 0) {
        pbVar2 = (byte *)((long)pGVar17->Fanins + (uVar27 - 4));
        *pbVar2 = *pbVar2 | 1;
        if ((Gla_Obj_t *)((long)pGVar17->Fanins + (uVar27 - 8)) <= pGVar17) {
          __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x6d,"int Gla_ObjId(Gla_Man_t *, Gla_Obj_t *)");
        }
        Vec_IntPush(pGVar13->vAbs,(int)(uVar27 >> 3) * -0x33333333);
      }
      lVar29 = uVar27 - 8;
      uVar27 = uVar27 + 0x28;
    } while ((Gla_Obj_t *)((long)pGVar17[1].Fanins + lVar29) < pGVar17 + (int)uVar36);
  }
  psVar19 = sat_solver2_new();
  pGVar13->pSat = psVar19;
  if (pPars->fUseFullProof != 0) {
    pVVar20 = (Vec_Set_t *)calloc(1,0x20);
    pVVar20->nPageSize = 0x14;
    pVVar20->uPageMask = 0xfffff;
    pVVar20->nPagesAlloc = 0x100;
    ppwVar21 = (word **)calloc(0x100,8);
    pVVar20->pPages = ppwVar21;
    pwVar22 = (word *)malloc(0x800000);
    *ppwVar21 = pwVar22;
    pwVar22[1] = 0xffffffffffffffff;
    *pwVar22 = 2;
    psVar19->pPrf1 = pVVar20;
  }
  pAVar9 = pGVar13->pPars;
  uVar3 = pAVar9->nLearnedDelta;
  uVar4 = pAVar9->nLearnedPerce;
  iVar10 = pAVar9->nLearnedStart;
  psVar19->nLearntMax = iVar10;
  psVar19->nLearntStart = iVar10;
  psVar19->nLearntDelta = uVar3;
  psVar19->nLearntRatio = uVar4;
  pGVar13->nSatVars = 1;
  pRVar23 = Rnm_ManStart(p);
  pGVar13->pRnm = pRVar23;
  return pGVar13;
}

Assistant:

Gla_Man_t * Gla_ManStart( Gia_Man_t * pGia0, Abs_Par_t * pPars )
{
    Gla_Man_t * p;
    Aig_Man_t * pAig;
    Gia_Obj_t * pObj;
    Gla_Obj_t * pGla;
    Vec_Int_t * vMappingNew;
    int i, k, Offset, * pMapping, * pLits, * pObj2Count, * pObj2Clause;

    // start
    p = ABC_CALLOC( Gla_Man_t, 1 );
    p->pGia0 = pGia0;
    p->pPars = pPars;
    p->vAbs  = Vec_IntAlloc( 100 );
    p->vTemp = Vec_IntAlloc( 100 );
    p->vAddedNew = Vec_IntAlloc( 100 );
    p->vObjCounts = Vec_IntAlloc( 100 );

    // internal data
    pAig = Gia_ManToAigSimple( pGia0 );
    p->pCnf = Cnf_DeriveOther( pAig, 1 );
    Aig_ManStop( pAig );
    // create working GIA
    p->pGia = Gia_ManDupMapped( pGia0, p->pCnf->vMapping );
    if ( pPars->fPropFanout )
        Gia_ManStaticFanoutStart( p->pGia );

    // derive new gate map
    assert( pGia0->vGateClasses != 0 );
    p->pGia->vGateClasses = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vCoreCounts = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vProofIds = Vec_IntAlloc(0);
    // update p->pCnf->vMapping, p->pCnf->pObj2Count, p->pCnf->pObj2Clause 
    // (here are not updating p->pCnf->pVarNums because it is not needed)
    vMappingNew = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( pGia0, pObj, i )
    {
        // skip internal nodes not used in the mapping
        if ( !~pObj->Value )
            continue;
        // replace positive literal by variable
        assert( !Abc_LitIsCompl(pObj->Value) );
        pObj->Value = Abc_Lit2Var(pObj->Value);
        assert( (int)pObj->Value < Gia_ManObjNum(p->pGia) );
        // update arrays
        pObj2Count[pObj->Value] = p->pCnf->pObj2Count[i];
        pObj2Clause[pObj->Value] = p->pCnf->pObj2Clause[i];
        if ( Vec_IntEntry(pGia0->vGateClasses, i) )
            Vec_IntWriteEntry( p->pGia->vGateClasses, pObj->Value, 1 );
        // update mappings
        Offset = Vec_IntEntry(p->pCnf->vMapping, i);
        Vec_IntWriteEntry( vMappingNew, pObj->Value, Vec_IntSize(vMappingNew) );
        pMapping = Vec_IntEntryP(p->pCnf->vMapping, Offset);
        Vec_IntPush( vMappingNew, pMapping[0] );
        for ( k = 1; k <= 4; k++ )
        {
            if ( pMapping[k] == -1 )
                Vec_IntPush( vMappingNew, -1 );
            else
            {
                assert( ~Gia_ManObj(pGia0, pMapping[k])->Value );
                Vec_IntPush( vMappingNew, Gia_ManObj(pGia0, pMapping[k])->Value );
            }
        }
    }
    // update mapping after the offset (currently not being done because it is not used)
    Vec_IntFree( p->pCnf->vMapping );  p->pCnf->vMapping    = vMappingNew;
    ABC_FREE( p->pCnf->pObj2Count );   p->pCnf->pObj2Count  = pObj2Count;
    ABC_FREE( p->pCnf->pObj2Clause );  p->pCnf->pObj2Clause = pObj2Clause;


    // count the number of variables
    p->nObjs = 1;
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( p->pCnf->pObj2Count[i] >= 0 )
            pObj->Value = p->nObjs++;
        else
            pObj->Value = ~0;

    // re-express CNF using new variable IDs
    pLits = p->pCnf->pClauses[0];
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
    {
        // find the original AIG object
        pObj = Gia_ManObj( pGia0, lit_var(pLits[i]) );
        assert( ~pObj->Value );
        // find the working AIG object
        pObj = Gia_ManObj( p->pGia, pObj->Value );
        assert( ~pObj->Value );
        // express literal in terms of LUT variables
        pLits[i] = toLitCond( pObj->Value, lit_sign(pLits[i]) );
    }

    // create objects 
    p->pObjs    = ABC_CALLOC( Gla_Obj_t, p->nObjs );
    p->pObj2Obj = ABC_FALLOC( unsigned, Gia_ManObjNum(p->pGia) );
//    p->pvRefis  = ABC_CALLOC( Vec_Int_t, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        p->pObj2Obj[i] = pObj->Value;
        if ( !~pObj->Value )
            continue;
        pGla = Gla_ManObj( p, pObj->Value );
        pGla->iGiaObj = i;
        pGla->fCompl0 = Gia_ObjFaninC0(pObj);
        pGla->fConst  = Gia_ObjIsConst0(pObj);
        pGla->fPi     = Gia_ObjIsPi(p->pGia, pObj);
        pGla->fPo     = Gia_ObjIsPo(p->pGia, pObj);
        pGla->fRi     = Gia_ObjIsRi(p->pGia, pObj);
        pGla->fRo     = Gia_ObjIsRo(p->pGia, pObj);
        pGla->fAnd    = Gia_ObjIsAnd(pObj);
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            pGla->nFanins = 1;
            pGla->Fanins[0] = Gia_ObjFanin0(pObj)->Value;
            continue;
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
//            Gla_ManCollectFanins( p, pGla, pObj->Value, p->vTemp );
//            pGla->nFanins = Vec_IntSize( p->vTemp );
//            memcpy( pGla->Fanins, Vec_IntArray(p->vTemp), sizeof(int) * Vec_IntSize(p->vTemp) );
            Offset = Vec_IntEntry( p->pCnf->vMapping, i );
            pMapping = Vec_IntEntryP( p->pCnf->vMapping, Offset );
            pGla->nFanins = 0;
            for ( k = 1; k <= 4; k++ )
                if ( pMapping[k] != -1 )
                    pGla->Fanins[ pGla->nFanins++ ] = Gia_ManObj(p->pGia, pMapping[k])->Value;
            continue;
        }
        assert( Gia_ObjIsRo(p->pGia, pObj) );
        pGla->nFanins   = 1;
        pGla->Fanins[0] = Gia_ObjFanin0( Gia_ObjRoToRi(p->pGia, pObj) )->Value;
        pGla->fCompl0   = Gia_ObjFaninC0( Gia_ObjRoToRi(p->pGia, pObj) );
    }
    p->pObjRoot = Gla_ManObj( p, Gia_ManPo(p->pGia, 0)->Value );
    // abstraction 
    assert( p->pGia->vGateClasses != NULL );
    Gla_ManForEachObj( p, pGla )
    {
        if ( Vec_IntEntry( p->pGia->vGateClasses, pGla->iGiaObj ) == 0 )
            continue;
        pGla->fAbs = 1;
        Vec_IntPush( p->vAbs, Gla_ObjId(p, pGla) );
    }
    // other 
    p->pSat        = sat_solver2_new();
    if ( pPars->fUseFullProof )
        p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    p->nSatVars  = 1;
    // start the refinement manager
//    p->pGia2 = Gia_ManDup( p->pGia );
    p->pRnm = Rnm_ManStart( p->pGia );
    return p;
}